

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O0

FT_Int32 af_loader_compute_darkening(AF_Loader loader,FT_Face face,FT_Pos standard_width)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  AF_Module pAVar9;
  uint uVar10;
  uint uVar11;
  FT_Int32 FVar12;
  FT_Long FVar13;
  FT_Long FVar14;
  uint b;
  FT_Long local_b8;
  FT_Int x_2;
  FT_Int ydelta_2;
  FT_Int xdelta_2;
  FT_Int x_1;
  FT_Int ydelta_1;
  FT_Int xdelta_1;
  FT_Int x;
  FT_Int ydelta;
  FT_Int xdelta;
  FT_Int y4;
  FT_Int x4;
  FT_Int y3;
  FT_Int x3;
  FT_Int y2;
  FT_Int x2;
  FT_Int y1;
  FT_Int x1;
  FT_Int log_base_2;
  FT_Fixed darken_amount;
  FT_Fixed scaled_stem;
  FT_Fixed stem_width_per_1000;
  FT_Fixed stem_width;
  FT_Fixed em_ratio;
  FT_Fixed ppem;
  FT_UShort units_per_EM;
  AF_Module module;
  FT_Pos standard_width_local;
  FT_Face face_local;
  AF_Loader loader_local;
  
  pAVar9 = loader->globals->module;
  if ((ulong)(face->size->metrics).x_ppem * 0x10000 < 0x40000) {
    local_b8 = 0x40000;
  }
  else {
    local_b8 = (ulong)(face->size->metrics).x_ppem << 0x10;
  }
  FVar13 = FT_DivFix(0x3e80000,(ulong)face->units_per_EM << 0x10);
  if (FVar13 < 0x28f) {
    return 0;
  }
  iVar1 = pAVar9->darken_params[0];
  iVar2 = pAVar9->darken_params[1];
  iVar3 = pAVar9->darken_params[2];
  iVar4 = pAVar9->darken_params[3];
  iVar5 = pAVar9->darken_params[4];
  iVar6 = pAVar9->darken_params[5];
  iVar7 = pAVar9->darken_params[6];
  iVar8 = pAVar9->darken_params[7];
  if (standard_width < 1) {
    scaled_stem._0_4_ = 0x4b0000;
  }
  else {
    scaled_stem._0_4_ = FT_MulFix_x86_64((int)standard_width << 0x10,(FT_Int32)FVar13);
  }
  uVar10 = 0x1f;
  if ((uint)scaled_stem != 0) {
    for (; (uint)scaled_stem >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar11 = 0x1f;
  b = (uint)local_b8;
  if (b != 0) {
    for (; b >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  if ((int)((0x3e - (uVar11 ^ 0x1f)) - (uVar10 ^ 0x1f)) < 0x2e) {
    FVar12 = FT_MulFix_x86_64((uint)scaled_stem,b);
    darken_amount = (FT_Fixed)FVar12;
  }
  else {
    darken_amount = (FT_Fixed)(uint)(iVar7 << 0x10);
  }
  if (darken_amount < (long)(ulong)(uint)(iVar1 << 0x10)) {
    _x1 = FT_DivFix((ulong)(uint)(iVar2 << 0x10),local_b8);
    goto LAB_00364eaa;
  }
  if (darken_amount < (long)(ulong)(uint)(iVar3 << 0x10)) {
    FVar14 = FT_DivFix((ulong)(uint)(iVar1 << 0x10),local_b8);
    if (iVar3 - iVar1 != 0) {
      _x1 = FT_MulDiv((long)(int)((uint)scaled_stem - (int)FVar14),(long)(iVar4 - iVar2),
                      (long)(iVar3 - iVar1));
      FVar14 = FT_DivFix((ulong)(uint)(iVar2 << 0x10),local_b8);
      _x1 = _x1 + FVar14;
      goto LAB_00364eaa;
    }
LAB_00364d35:
    FVar14 = FT_DivFix((ulong)(uint)(iVar3 << 0x10),local_b8);
    if (iVar5 - iVar3 != 0) {
      _x1 = FT_MulDiv((long)(int)((uint)scaled_stem - (int)FVar14),(long)(iVar6 - iVar4),
                      (long)(iVar5 - iVar3));
      FVar14 = FT_DivFix((ulong)(uint)(iVar4 << 0x10),local_b8);
      _x1 = _x1 + FVar14;
      goto LAB_00364eaa;
    }
LAB_00364dea:
    FVar14 = FT_DivFix((ulong)(uint)(iVar5 << 0x10),local_b8);
    if (iVar7 - iVar5 != 0) {
      _x1 = FT_MulDiv((long)(int)((uint)scaled_stem - (int)FVar14),(long)(iVar8 - iVar6),
                      (long)(iVar7 - iVar5));
      FVar14 = FT_DivFix((ulong)(uint)(iVar6 << 0x10),local_b8);
      _x1 = _x1 + FVar14;
      goto LAB_00364eaa;
    }
  }
  else {
    if (darken_amount < (long)(ulong)(uint)(iVar5 << 0x10)) goto LAB_00364d35;
    if (darken_amount < (long)(ulong)(uint)(iVar7 << 0x10)) goto LAB_00364dea;
  }
  _x1 = FT_DivFix((ulong)(uint)(iVar8 << 0x10),local_b8);
LAB_00364eaa:
  FVar13 = FT_DivFix(_x1,FVar13);
  return (int)(short)((uint)((int)FVar13 + 0x8000) >> 0x10);
}

Assistant:

FT_LOCAL_DEF( FT_Int32 )
  af_loader_compute_darkening( AF_Loader  loader,
                               FT_Face    face,
                               FT_Pos     standard_width )
  {
    AF_Module  module = loader->globals->module;

    FT_UShort  units_per_EM;
    FT_Fixed   ppem, em_ratio;
    FT_Fixed   stem_width, stem_width_per_1000, scaled_stem, darken_amount;
    FT_Int     log_base_2;
    FT_Int     x1, y1, x2, y2, x3, y3, x4, y4;


    ppem         = FT_MAX( af_intToFixed( 4 ),
                           af_intToFixed( face->size->metrics.x_ppem ) );
    units_per_EM = face->units_per_EM;

    em_ratio = FT_DivFix( af_intToFixed( 1000 ),
                          af_intToFixed ( units_per_EM ) );
    if ( em_ratio < af_floatToFixed( .01 ) )
    {
      /* If something goes wrong, don't embolden. */
      return 0;
    }

    x1 = module->darken_params[0];
    y1 = module->darken_params[1];
    x2 = module->darken_params[2];
    y2 = module->darken_params[3];
    x3 = module->darken_params[4];
    y3 = module->darken_params[5];
    x4 = module->darken_params[6];
    y4 = module->darken_params[7];

    if ( standard_width <= 0 )
    {
      stem_width          = af_intToFixed( 75 ); /* taken from cf2font.c */
      stem_width_per_1000 = stem_width;
    }
    else
    {
      stem_width          = af_intToFixed( standard_width );
      stem_width_per_1000 = FT_MulFix( stem_width, em_ratio );
    }

    log_base_2 = FT_MSB( (FT_UInt32)stem_width_per_1000 ) +
                 FT_MSB( (FT_UInt32)ppem );

    if ( log_base_2 >= 46 )
    {
      /* possible overflow */
      scaled_stem = af_intToFixed( x4 );
    }
    else
      scaled_stem = FT_MulFix( stem_width_per_1000, ppem );

    /* now apply the darkening parameters */
    if ( scaled_stem < af_intToFixed( x1 ) )
      darken_amount = FT_DivFix( af_intToFixed( y1 ), ppem );

    else if ( scaled_stem < af_intToFixed( x2 ) )
    {
      FT_Int  xdelta = x2 - x1;
      FT_Int  ydelta = y2 - y1;
      FT_Int  x      = stem_width_per_1000 -
                       FT_DivFix( af_intToFixed( x1 ), ppem );


      if ( !xdelta )
        goto Try_x3;

      darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                      FT_DivFix( af_intToFixed( y1 ), ppem );
    }

    else if ( scaled_stem < af_intToFixed( x3 ) )
    {
    Try_x3:
      {
        FT_Int  xdelta = x3 - x2;
        FT_Int  ydelta = y3 - y2;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x2 ), ppem );


        if ( !xdelta )
          goto Try_x4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y2 ), ppem );
      }
    }

    else if ( scaled_stem < af_intToFixed( x4 ) )
    {
    Try_x4:
      {
        FT_Int  xdelta = x4 - x3;
        FT_Int  ydelta = y4 - y3;
        FT_Int  x      = stem_width_per_1000 -
                         FT_DivFix( af_intToFixed( x3 ), ppem );


        if ( !xdelta )
          goto Use_y4;

        darken_amount = FT_MulDiv( x, ydelta, xdelta ) +
                        FT_DivFix( af_intToFixed( y3 ), ppem );
      }
    }

    else
    {
    Use_y4:
      darken_amount = FT_DivFix( af_intToFixed( y4 ), ppem );
    }

    /* Convert darken_amount from per 1000 em to true character space. */
    return af_fixedToInt( FT_DivFix( darken_amount, em_ratio ) );
  }